

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel.h
# Opt level: O0

string * __thiscall
Dashel::Stream::getTargetName_abi_cxx11_(string *__return_storage_ptr__,Stream *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Stream *local_18;
  Stream *this_local;
  
  local_18 = this;
  this_local = (Stream *)__return_storage_ptr__;
  std::operator+(&local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x78),
                 ":");
  Dashel::ParameterSet::getString_abi_cxx11_();
  std::operator+(__return_storage_ptr__,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string getTargetName() const { return protocolName + ":" + target.getString(); }